

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushFocusScope(ImGuiID id)

{
  ImGuiID in_EDI;
  ImGuiContext *g;
  uint *in_stack_ffffffffffffffe8;
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  ImVector<unsigned_int>::push_back((ImVector<unsigned_int> *)GImGui,in_stack_ffffffffffffffe8);
  pIVar1->CurrentFocusScopeId = in_EDI;
  return;
}

Assistant:

void ImGui::PushFocusScope(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    g.FocusScopeStack.push_back(id);
    g.CurrentFocusScopeId = id;
}